

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O0

unsigned_long __thiscall ByteString::long_val(ByteString *this)

{
  ulong uVar1;
  unsigned_long *puVar2;
  byte *pbVar3;
  long in_RDI;
  size_t i;
  unsigned_long rv;
  size_type local_28;
  unsigned_long local_20;
  ulong local_18;
  unsigned_long local_10;
  
  local_10 = 0;
  local_18 = 0;
  while( true ) {
    uVar1 = local_18;
    local_20 = 8;
    local_28 = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::size
                         ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)(in_RDI + 8));
    puVar2 = std::min<unsigned_long>(&local_20,&local_28);
    if (*puVar2 <= uVar1) break;
    local_10 = local_10 << 8;
    pbVar3 = std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_SecureAllocator<unsigned_char>_> *)(in_RDI + 8),
                        local_18);
    local_10 = *pbVar3 + local_10;
    local_18 = local_18 + 1;
  }
  return local_10;
}

Assistant:

unsigned long ByteString::long_val() const
{
	// Convert the first 8 bytes of the string to an unsigned long value
	unsigned long rv = 0;

	for (size_t i = 0; i < std::min(size_t(8), byteString.size()); i++)
	{
		rv <<= 8;
		rv += byteString[i];
	}

	return rv;
}